

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

int capnp::_::PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::init(EVP_PKEY_CTX *ctx)

{
  Which elementType;
  SegmentBuilder *pSVar1;
  CapTableBuilder *pCVar2;
  undefined8 uVar3;
  ElementSize elementSize;
  StructSize elementSize_00;
  ElementCount in_ECX;
  undefined8 in_RDX;
  ulong in_RSI;
  ListBuilder *__return_storage_ptr__;
  Schema in_stack_ffffffffffffff68;
  ListSchema schema_local;
  ListBuilder local_80;
  ListBuilder local_58;
  
  if ((Which)in_RSI == STRUCT && (in_RSI & 0xff0000) == 0) {
    Type::asStruct(&schema_local.elementType);
    elementSize_00 =
         anon_unknown_71::structSizeFromSchema((StructSchema)in_stack_ffffffffffffff68.raw);
    __return_storage_ptr__ = &local_58;
    PointerBuilder::initStructList
              (__return_storage_ptr__,(PointerBuilder *)&stack0x00000008,in_ECX,elementSize_00);
  }
  else {
    elementType = LIST;
    if ((in_RSI & 0xff0000) == 0) {
      elementType = (Which)in_RSI;
    }
    elementSize = anon_unknown_71::elementSizeFor(elementType);
    __return_storage_ptr__ = &local_80;
    PointerBuilder::initList
              (__return_storage_ptr__,(PointerBuilder *)&stack0x00000008,elementSize,in_ECX);
  }
  *(undefined8 *)(ctx + 0x30) = *(undefined8 *)&__return_storage_ptr__->structDataSize;
  pSVar1 = __return_storage_ptr__->segment;
  pCVar2 = __return_storage_ptr__->capTable;
  uVar3 = *(undefined8 *)&__return_storage_ptr__->elementCount;
  *(byte **)(ctx + 0x20) = __return_storage_ptr__->ptr;
  *(undefined8 *)(ctx + 0x28) = uVar3;
  *(SegmentBuilder **)(ctx + 0x10) = pSVar1;
  *(CapTableBuilder **)(ctx + 0x18) = pCVar2;
  *(ulong *)ctx = in_RSI;
  *(undefined8 *)(ctx + 8) = in_RDX;
  return (int)ctx;
}

Assistant:

DynamicList::Builder PointerHelpers<DynamicList, Kind::OTHER>::init(
    PointerBuilder builder, ListSchema schema, uint size) {
  if (schema.whichElementType() == schema::Type::STRUCT) {
    return DynamicList::Builder(schema,
        builder.initStructList(bounded(size) * ELEMENTS,
            structSizeFromSchema(schema.getStructElementType())));
  } else {
    return DynamicList::Builder(schema,
        builder.initList(elementSizeFor(schema.whichElementType()), bounded(size) * ELEMENTS));
  }
}